

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

uchar * cppcms::b64url::decode(uchar *begin,uchar *end,uchar *target)

{
  uchar uVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  char cVar14;
  undefined1 auVar15 [14];
  undefined1 auVar16 [12];
  unkbyte10 Var17;
  undefined1 auVar18 [14];
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  short sVar27;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  undefined1 auVar33 [16];
  undefined1 auVar38 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  uint uVar56;
  byte bVar57;
  byte bVar59;
  byte bVar61;
  byte bVar63;
  char cVar64;
  char cVar80;
  char cVar81;
  char cVar82;
  undefined1 auVar68 [16];
  undefined1 auVar76 [16];
  undefined1 auVar83 [16];
  uchar in [4];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar28;
  undefined6 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar34 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar51 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar39 [14];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined2 uVar55;
  char cVar58;
  char cVar60;
  char cVar62;
  undefined1 auVar69 [16];
  undefined1 auVar77 [16];
  undefined1 auVar70 [16];
  undefined1 auVar65 [11];
  undefined1 auVar71 [16];
  undefined1 auVar78 [16];
  undefined1 auVar66 [12];
  undefined1 auVar72 [16];
  undefined1 auVar67 [13];
  undefined1 auVar73 [16];
  undefined1 auVar79 [16];
  undefined1 auVar75 [16];
  undefined1 auVar74 [16];
  
  auVar21 = _DAT_00242150;
  auVar20 = _DAT_00242140;
  for (uVar22 = (long)end - (long)begin; 3 < (long)uVar22; uVar22 = uVar22 - 4) {
    uVar28 = *(undefined4 *)begin;
    cVar58 = (char)uVar28;
    bVar57 = cVar58 + 0xbf;
    cVar60 = (char)((uint)uVar28 >> 8);
    bVar59 = cVar60 + 0xbf;
    cVar62 = (char)((uint)uVar28 >> 0x10);
    cVar14 = (char)((uint)uVar28 >> 0x18);
    bVar61 = cVar62 + 0xbf;
    bVar63 = cVar14 + 0xbf;
    auVar83._0_4_ =
         CONCAT13(-((byte)((0x19 < bVar63) * '\x19' | (0x19 >= bVar63) * bVar63) == bVar63),
                  CONCAT12(-((byte)((0x19 < bVar61) * '\x19' | (0x19 >= bVar61) * bVar61) == bVar61)
                           ,CONCAT11(-((byte)((0x19 < bVar59) * '\x19' | (0x19 >= bVar59) * bVar59)
                                      == bVar59),
                                     -((byte)((0x19 < bVar57) * '\x19' | (0x19 >= bVar57) * bVar57)
                                      == bVar57))));
    auVar83[4] = 0xff;
    auVar83[5] = 0xff;
    auVar83[6] = 0xff;
    auVar83[7] = 0xff;
    auVar83[8] = 0xff;
    auVar83[9] = 0xff;
    auVar83[10] = 0xff;
    auVar83[0xb] = 0xff;
    auVar83[0xc] = 0xff;
    auVar83[0xd] = 0xff;
    auVar83[0xe] = 0xff;
    auVar83[0xf] = 0xff;
    bVar26 = cVar58 + 0x85;
    bVar35 = cVar60 + 0x85;
    bVar36 = cVar62 + 0x85;
    bVar37 = cVar14 + 0x85;
    auVar40[0] = -((byte)((bVar26 < 0xe6) * -0x1a | (bVar26 >= 0xe6) * bVar26) == bVar26);
    auVar40[1] = -((byte)((bVar35 < 0xe6) * -0x1a | (bVar35 >= 0xe6) * bVar35) == bVar35);
    auVar40[2] = -((byte)((bVar36 < 0xe6) * -0x1a | (bVar36 >= 0xe6) * bVar36) == bVar36);
    auVar40[3] = -((byte)((bVar37 < 0xe6) * -0x1a | (bVar37 >= 0xe6) * bVar37) == bVar37);
    auVar40[4] = 0xff;
    auVar40[5] = 0xff;
    auVar40[6] = 0xff;
    auVar40[7] = 0xff;
    auVar40[8] = 0xff;
    auVar40[9] = 0xff;
    auVar40[10] = 0xff;
    auVar40[0xb] = 0xff;
    auVar40[0xc] = 0xff;
    auVar40[0xd] = 0xff;
    auVar40[0xe] = 0xff;
    auVar40[0xf] = 0xff;
    auVar40 = auVar40 | auVar83;
    auVar48._0_14_ = auVar40._0_14_;
    auVar48[0xe] = auVar40[7];
    auVar48[0xf] = auVar40[7];
    auVar47._14_2_ = auVar48._14_2_;
    auVar47._0_13_ = auVar40._0_13_;
    auVar47[0xd] = auVar40[6];
    auVar46._13_3_ = auVar47._13_3_;
    auVar46._0_12_ = auVar40._0_12_;
    auVar46[0xc] = auVar40[6];
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._0_11_ = auVar40._0_11_;
    auVar45[0xb] = auVar40[5];
    auVar44._11_5_ = auVar45._11_5_;
    auVar44._0_10_ = auVar40._0_10_;
    auVar44[10] = auVar40[5];
    auVar43._10_6_ = auVar44._10_6_;
    auVar43._0_9_ = auVar40._0_9_;
    auVar43[9] = auVar40[4];
    auVar42._9_7_ = auVar43._9_7_;
    auVar42._0_8_ = auVar40._0_8_;
    auVar42[8] = auVar40[4];
    Var17 = CONCAT91(CONCAT81(auVar42._8_8_,auVar40[3]),auVar40[3]);
    auVar16._2_10_ = Var17;
    auVar16[1] = auVar40[2];
    auVar16[0] = auVar40[2];
    auVar15._2_12_ = auVar16;
    auVar15[1] = auVar40[1];
    auVar15[0] = auVar40[1];
    auVar41._0_2_ = CONCAT11(auVar40[0],auVar40[0]);
    auVar41._2_14_ = auVar15;
    uVar55 = (undefined2)Var17;
    auVar52._0_12_ = auVar41._0_12_;
    auVar52._12_2_ = uVar55;
    auVar52._14_2_ = uVar55;
    auVar51._12_4_ = auVar52._12_4_;
    auVar51._0_10_ = auVar41._0_10_;
    auVar51._10_2_ = auVar16._0_2_;
    auVar50._10_6_ = auVar51._10_6_;
    auVar50._0_8_ = auVar41._0_8_;
    auVar50._8_2_ = auVar16._0_2_;
    auVar49._8_8_ = auVar50._8_8_;
    auVar49._6_2_ = auVar15._0_2_;
    auVar49._4_2_ = auVar15._0_2_;
    auVar49._2_2_ = auVar41._0_2_;
    auVar49._0_2_ = auVar41._0_2_;
    bVar26 = cVar58 - 0x30;
    bVar35 = cVar60 - 0x30;
    bVar36 = cVar62 - 0x30;
    bVar37 = cVar14 - 0x30;
    cVar64 = -((byte)((bVar26 < 10) * '\n' | (bVar26 >= 10) * bVar26) == bVar26);
    cVar80 = -((byte)((bVar35 < 10) * '\n' | (bVar35 >= 10) * bVar35) == bVar35);
    cVar81 = -((byte)((bVar36 < 10) * '\n' | (bVar36 >= 10) * bVar36) == bVar36);
    cVar82 = -((byte)((bVar37 < 10) * '\n' | (bVar37 >= 10) * bVar37) == bVar37);
    auVar70._0_9_ = CONCAT18(0xff,0xff00000000000000);
    auVar65._0_10_ = CONCAT19(0xff,auVar70._0_9_);
    auVar65[10] = 0xff;
    auVar66[0xb] = 0xff;
    auVar66._0_11_ = auVar65;
    auVar67[0xc] = 0xff;
    auVar67._0_12_ = auVar66;
    auVar75[0xd] = 0xff;
    auVar75._0_13_ = auVar67;
    auVar75[0xe] = 0xff;
    auVar75[0xf] = 0xff;
    auVar74._14_2_ = auVar75._14_2_;
    auVar74[0xd] = 0xff;
    auVar74._0_13_ = auVar67;
    auVar73._13_3_ = auVar74._13_3_;
    auVar73[0xc] = 0xff;
    auVar73._0_12_ = auVar66;
    auVar72._12_4_ = auVar73._12_4_;
    auVar72[0xb] = 0xff;
    auVar72._0_11_ = auVar65;
    auVar71._11_5_ = auVar72._11_5_;
    auVar71[10] = 0xff;
    auVar71._0_10_ = auVar65._0_10_;
    auVar70._10_6_ = auVar71._10_6_;
    auVar70[9] = 0xff;
    auVar69._9_7_ = auVar70._9_7_;
    auVar69[8] = 0xff;
    auVar69._0_8_ = 0xff00000000000000;
    Var17 = CONCAT91(CONCAT81(auVar69._8_8_,cVar82),cVar82);
    auVar19._2_10_ = Var17;
    auVar19[1] = cVar81;
    auVar19[0] = cVar81;
    auVar18._2_12_ = auVar19;
    auVar18[1] = cVar80;
    auVar18[0] = cVar80;
    auVar68._0_2_ = CONCAT11(cVar64,cVar64);
    auVar68._2_14_ = auVar18;
    uVar55 = (undefined2)Var17;
    auVar79._0_12_ = auVar68._0_12_;
    auVar79._12_2_ = uVar55;
    auVar79._14_2_ = uVar55;
    auVar78._12_4_ = auVar79._12_4_;
    auVar78._0_10_ = auVar68._0_10_;
    auVar78._10_2_ = auVar19._0_2_;
    auVar77._10_6_ = auVar78._10_6_;
    auVar77._0_8_ = auVar68._0_8_;
    auVar77._8_2_ = auVar19._0_2_;
    auVar76._8_8_ = auVar77._8_8_;
    auVar76._6_2_ = auVar18._0_2_;
    auVar76._4_2_ = auVar18._0_2_;
    auVar76._2_2_ = auVar68._0_2_;
    auVar76._0_2_ = auVar68._0_2_;
    auVar33 = ~auVar49 & auVar76 & auVar20;
    sVar6 = auVar33._0_2_;
    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar33[0] - (0xff < sVar6);
    sVar7 = auVar33._2_2_;
    sVar27 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar33[2] - (0xff < sVar7),cVar2);
    sVar8 = auVar33._4_2_;
    cVar64 = (0 < sVar8) * (sVar8 < 0x100) * auVar33[4] - (0xff < sVar8);
    sVar9 = auVar33._6_2_;
    uVar28 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar33[6] - (0xff < sVar9),
                      CONCAT12(cVar64,sVar27));
    sVar10 = auVar33._8_2_;
    cVar80 = (0 < sVar10) * (sVar10 < 0x100) * auVar33[8] - (0xff < sVar10);
    sVar11 = auVar33._10_2_;
    uVar29 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar33[10] - (0xff < sVar11),
                      CONCAT14(cVar80,uVar28));
    sVar12 = auVar33._12_2_;
    cVar81 = (0 < sVar12) * (sVar12 < 0x100) * auVar33[0xc] - (0xff < sVar12);
    sVar13 = auVar33._14_2_;
    uVar30 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar33[0xe] - (0xff < sVar13),
                      CONCAT16(cVar81,uVar29));
    cVar82 = (0 < sVar6) * (sVar6 < 0x100) * auVar33[0] - (0xff < sVar6);
    auVar31._0_10_ =
         CONCAT19((0 < sVar7) * (sVar7 < 0x100) * auVar33[2] - (0xff < sVar7),
                  CONCAT18(cVar82,uVar30));
    cVar3 = (0 < sVar8) * (sVar8 < 0x100) * auVar33[4] - (0xff < sVar8);
    auVar31[10] = cVar3;
    auVar31[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[6] - (0xff < sVar9);
    cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar33[8] - (0xff < sVar10);
    auVar32[0xc] = cVar4;
    auVar32._0_12_ = auVar31;
    auVar32[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar33[10] - (0xff < sVar11);
    cVar5 = (0 < sVar12) * (sVar12 < 0x100) * auVar33[0xc] - (0xff < sVar12);
    auVar34[0xe] = cVar5;
    auVar34._0_14_ = auVar32;
    auVar34[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar33[0xe] - (0xff < sVar13);
    sVar6 = (short)((uint)uVar28 >> 0x10);
    auVar33[1] = (0 < sVar6) * (sVar6 < 0x100) * cVar64 - (0xff < sVar6);
    auVar33[0] = (0 < sVar27) * (sVar27 < 0x100) * cVar2 - (0xff < sVar27);
    sVar7 = (short)((uint6)uVar29 >> 0x20);
    auVar33[2] = (0 < sVar7) * (sVar7 < 0x100) * cVar80 - (0xff < sVar7);
    sVar8 = (short)((ulong)uVar30 >> 0x30);
    auVar33[3] = (0 < sVar8) * (sVar8 < 0x100) * cVar81 - (0xff < sVar8);
    sVar9 = (short)((unkuint10)auVar31._0_10_ >> 0x40);
    auVar33[4] = (0 < sVar9) * (sVar9 < 0x100) * cVar82 - (0xff < sVar9);
    sVar10 = auVar31._10_2_;
    auVar33[5] = (0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10);
    sVar11 = auVar32._12_2_;
    auVar33[6] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
    sVar12 = auVar34._14_2_;
    auVar33[7] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
    auVar33[8] = (0 < sVar27) * (sVar27 < 0x100) * cVar2 - (0xff < sVar27);
    auVar33[9] = (0 < sVar6) * (sVar6 < 0x100) * cVar64 - (0xff < sVar6);
    auVar33[10] = (0 < sVar7) * (sVar7 < 0x100) * cVar80 - (0xff < sVar7);
    auVar33[0xb] = (0 < sVar8) * (sVar8 < 0x100) * cVar81 - (0xff < sVar8);
    auVar33[0xc] = (0 < sVar9) * (sVar9 < 0x100) * cVar82 - (0xff < sVar9);
    auVar33[0xd] = (0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10);
    auVar33[0xe] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
    auVar33[0xf] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
    auVar33 = psllw(auVar33,7);
    auVar33 = auVar33 & auVar21;
    uVar56 = CONCAT13(-(auVar33[3] < '\0'),
                      CONCAT12(-(auVar33[2] < '\0'),
                               CONCAT11(-(auVar33[1] < '\0'),-(auVar33[0] < '\0'))));
    auVar33 = ~auVar49 & (auVar76 ^ _DAT_002421c0) & auVar20;
    sVar6 = auVar33._0_2_;
    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar33[0] - (0xff < sVar6);
    sVar7 = auVar33._2_2_;
    sVar27 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar33[2] - (0xff < sVar7),cVar2);
    sVar8 = auVar33._4_2_;
    cVar5 = (0 < sVar8) * (sVar8 < 0x100) * auVar33[4] - (0xff < sVar8);
    sVar9 = auVar33._6_2_;
    uVar28 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar33[6] - (0xff < sVar9),
                      CONCAT12(cVar5,sVar27));
    sVar10 = auVar33._8_2_;
    cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar33[8] - (0xff < sVar10);
    sVar11 = auVar33._10_2_;
    uVar29 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar33[10] - (0xff < sVar11),
                      CONCAT14(cVar4,uVar28));
    sVar12 = auVar33._12_2_;
    cVar3 = (0 < sVar12) * (sVar12 < 0x100) * auVar33[0xc] - (0xff < sVar12);
    sVar13 = auVar33._14_2_;
    uVar30 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar33[0xe] - (0xff < sVar13),
                      CONCAT16(cVar3,uVar29));
    cVar64 = (0 < sVar6) * (sVar6 < 0x100) * auVar33[0] - (0xff < sVar6);
    auVar38._0_10_ =
         CONCAT19((0 < sVar7) * (sVar7 < 0x100) * auVar33[2] - (0xff < sVar7),
                  CONCAT18(cVar64,uVar30));
    cVar82 = (0 < sVar8) * (sVar8 < 0x100) * auVar33[4] - (0xff < sVar8);
    auVar38[10] = cVar82;
    auVar38[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[6] - (0xff < sVar9);
    cVar81 = (0 < sVar10) * (sVar10 < 0x100) * auVar33[8] - (0xff < sVar10);
    auVar39[0xc] = cVar81;
    auVar39._0_12_ = auVar38;
    auVar39[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar33[10] - (0xff < sVar11);
    cVar80 = (0 < sVar12) * (sVar12 < 0x100) * auVar33[0xc] - (0xff < sVar12);
    auVar53[0xe] = cVar80;
    auVar53._0_14_ = auVar39;
    auVar53[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar33[0xe] - (0xff < sVar13);
    sVar6 = (short)((uint)uVar28 >> 0x10);
    auVar54[1] = (0 < sVar6) * (sVar6 < 0x100) * cVar5 - (0xff < sVar6);
    auVar54[0] = (0 < sVar27) * (sVar27 < 0x100) * cVar2 - (0xff < sVar27);
    sVar7 = (short)((uint6)uVar29 >> 0x20);
    auVar54[2] = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
    sVar8 = (short)((ulong)uVar30 >> 0x30);
    auVar54[3] = (0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8);
    sVar9 = (short)((unkuint10)auVar38._0_10_ >> 0x40);
    auVar54[4] = (0 < sVar9) * (sVar9 < 0x100) * cVar64 - (0xff < sVar9);
    sVar10 = auVar38._10_2_;
    auVar54[5] = (0 < sVar10) * (sVar10 < 0x100) * cVar82 - (0xff < sVar10);
    sVar11 = auVar39._12_2_;
    auVar54[6] = (0 < sVar11) * (sVar11 < 0x100) * cVar81 - (0xff < sVar11);
    sVar12 = auVar53._14_2_;
    auVar54[7] = (0 < sVar12) * (sVar12 < 0x100) * cVar80 - (0xff < sVar12);
    auVar54[8] = (0 < sVar27) * (sVar27 < 0x100) * cVar2 - (0xff < sVar27);
    auVar54[9] = (0 < sVar6) * (sVar6 < 0x100) * cVar5 - (0xff < sVar6);
    auVar54[10] = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
    auVar54[0xb] = (0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8);
    auVar54[0xc] = (0 < sVar9) * (sVar9 < 0x100) * cVar64 - (0xff < sVar9);
    auVar54[0xd] = (0 < sVar10) * (sVar10 < 0x100) * cVar82 - (0xff < sVar10);
    auVar54[0xe] = (0 < sVar11) * (sVar11 < 0x100) * cVar81 - (0xff < sVar11);
    auVar54[0xf] = (0 < sVar12) * (sVar12 < 0x100) * cVar80 - (0xff < sVar12);
    auVar33 = psllw(auVar54,7);
    auVar33 = auVar33 & auVar21;
    bVar26 = -(auVar33[0] < '\0');
    bVar35 = -(auVar33[1] < '\0');
    bVar36 = -(auVar33[2] < '\0');
    bVar37 = -(auVar33[3] < '\0');
    uVar23 = CONCAT13(-(cVar14 == '-'),
                      CONCAT12(-(cVar62 == '-'),CONCAT11(-(cVar60 == '-'),-(cVar58 == '-'))));
    uVar23 = auVar83._0_4_ & CONCAT13(bVar63,CONCAT12(bVar61,CONCAT11(bVar59,bVar57))) |
             ~auVar83._0_4_ &
             (~uVar56 & CONCAT13((bVar37 & 4 | ~bVar37 & 0xb9) + cVar14,
                                 CONCAT12((bVar36 & 4 | ~bVar36 & 0xb9) + cVar62,
                                          CONCAT11((bVar35 & 4 | ~bVar35 & 0xb9) + cVar60,
                                                   (bVar26 & 4 | ~bVar26 & 0xb9) + cVar58))) |
             (uVar23 & 0x3e3e3e3e |
             ~uVar23 & CONCAT13(-(cVar14 == '_'),
                                CONCAT12(-(cVar62 == '_'),
                                         CONCAT11(-(cVar60 == '_'),-(cVar58 == '_')))) & 0x3f3f3f3f)
             & uVar56);
    bVar26 = (byte)(uVar23 >> 8);
    *target = bVar26 >> 4 | (char)uVar23 * '\x04';
    bVar35 = (byte)(uVar23 >> 0x10);
    target[1] = bVar35 >> 2 | bVar26 << 4;
    target[2] = (byte)(uVar23 >> 0x18) | bVar35 << 6;
    begin = begin + 4;
    target = target + 3;
  }
  if (begin != end) {
    in[0] = '\0';
    in[1] = '\0';
    in[2] = '\0';
    in[3] = '\0';
    uVar24 = 0;
    do {
      uVar1 = begin[uVar24];
      bVar26 = uVar1 + 0xbf;
      if (0x19 < bVar26) {
        if ((byte)(uVar1 + 0x9f) < 0x1a) {
          bVar26 = uVar1 + 0xb9;
        }
        else if ((byte)(uVar1 - 0x30) < 10) {
          bVar26 = uVar1 + 4;
        }
        else {
          bVar26 = 0x3f;
          if (uVar1 != '_') {
            bVar26 = 0;
          }
          if (uVar1 == '-') {
            bVar26 = 0x3e;
          }
        }
      }
      in[uVar24] = bVar26;
      uVar24 = uVar24 + 1;
    } while ((uVar24 & 0xffffffff) < uVar22);
    *target = in[1] >> 4 | in[0] << 2;
    lVar25 = 1;
    if (uVar22 != 2) {
      target[1] = in[2] >> 2 | in[1] << 4;
      lVar25 = 2;
      if (uVar22 != 3) {
        target[2] = in[2] << 6 | in[3];
        lVar25 = 3;
      }
    }
    target = target + lVar25;
  }
  return target;
}

Assistant:

unsigned char *decode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=4) {
		bdecode(begin,target,4);
		begin+=4;
		target+=3;
	}
	if(end!=begin)
		target+=bdecode(begin,target,end-begin);
	return target;
}